

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-utils.h
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::OptUtils::FunctionRefReplacer::create(FunctionRefReplacer *this)

{
  undefined8 local_20;
  
  std::make_unique<wasm::OptUtils::FunctionRefReplacer,std::function<void(wasm::Name&)>&>
            ((function<void_(wasm::Name_&)> *)&stack0xffffffffffffffe0);
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)local_20;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FunctionRefReplacer>(maybeReplace);
  }